

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

void __thiscall MeCab::FeatureIndex::calcCost(FeatureIndex *this,LearnerPath *path)

{
  double *pdVar1;
  bool bVar2;
  int *piVar3;
  double dVar4;
  
  bVar2 = is_empty(path);
  if (!bVar2) {
    piVar3 = path->fvector;
    dVar4 = path->rnode->wcost;
    path->cost = dVar4;
    pdVar1 = this->alpha_;
    for (; (long)*piVar3 != -1; piVar3 = piVar3 + 1) {
      dVar4 = dVar4 + pdVar1[*piVar3];
      path->cost = dVar4;
    }
  }
  return;
}

Assistant:

void FeatureIndex::calcCost(LearnerPath *path) {
  if (is_empty(path)) return;
  path->cost = path->rnode->wcost;
  for (const int *f = path->fvector; *f != -1; ++f) {
    path->cost += alpha_[*f];
  }
}